

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O0

Ops * __thiscall miniscript::Node<XOnlyPubKey>::CalcOps(Node<XOnlyPubKey> *this)

{
  uint uVar1;
  bool bVar2;
  element_type *peVar3;
  size_type sVar4;
  undefined4 *in_RSI;
  Ops *in_RDI;
  long in_FS_OFFSET;
  size_t j;
  shared_ptr<const_miniscript::Node<XOnlyPubKey>_> *sub;
  vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  *__range4;
  uint32_t count_6;
  uint32_t count_5;
  uint32_t count_4;
  uint32_t count_3;
  uint32_t count_2;
  uint32_t count_1;
  uint32_t count;
  vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
  next_sats;
  iterator __end0;
  iterator __begin0;
  vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
  sats;
  MaxInt<unsigned_int> dsat_4;
  MaxInt<unsigned_int> sat_5;
  MaxInt<unsigned_int> dsat_3;
  MaxInt<unsigned_int> sat_4;
  MaxInt<unsigned_int> sat_3;
  MaxInt<unsigned_int> dsat_2;
  MaxInt<unsigned_int> sat_2;
  MaxInt<unsigned_int> dsat_1;
  MaxInt<unsigned_int> sat_1;
  MaxInt<unsigned_int> dsat;
  MaxInt<unsigned_int> sat;
  Ops *in_stack_fffffffffffffbd8;
  MaxInt<unsigned_int> in_stack_fffffffffffffbe0;
  MaxInt<unsigned_int> in_stack_fffffffffffffbe8;
  MaxInt<unsigned_int> in_sat;
  MaxInt<unsigned_int> in_stack_fffffffffffffc18;
  ulong local_2a8;
  undefined1 local_1e8 [36];
  MaxInt<unsigned_int> local_1c4;
  uint32_t local_1bc;
  MaxInt<unsigned_int> local_1b0;
  MaxInt<unsigned_int> local_1a0;
  MaxInt<unsigned_int> local_198;
  MaxInt<unsigned_int> local_190;
  MaxInt<unsigned_int> local_188;
  MaxInt<unsigned_int> local_180;
  MaxInt<unsigned_int> local_158;
  MaxInt<unsigned_int> local_150;
  MaxInt<unsigned_int> local_148;
  MaxInt<unsigned_int> local_140;
  MaxInt<unsigned_int> local_138;
  MaxInt<unsigned_int> local_130;
  MaxInt<unsigned_int> local_128;
  MaxInt<unsigned_int> local_120;
  MaxInt<unsigned_int> local_118;
  MaxInt<unsigned_int> local_110;
  MaxInt<unsigned_int> local_100;
  MaxInt<unsigned_int> local_f8;
  MaxInt<unsigned_int> local_f0;
  MaxInt<unsigned_int> local_e8;
  MaxInt<unsigned_int> local_e0;
  MaxInt<unsigned_int> local_d8;
  MaxInt<unsigned_int> local_d0;
  MaxInt<unsigned_int> local_c8;
  MaxInt<unsigned_int> local_c0;
  MaxInt<unsigned_int> local_b8;
  MaxInt<unsigned_int> local_b0;
  MaxInt<unsigned_int> local_a8;
  MaxInt<unsigned_int> local_a0;
  MaxInt<unsigned_int> local_98;
  MaxInt<unsigned_int> local_90;
  MaxInt<unsigned_int> local_88;
  MaxInt<unsigned_int> local_80;
  MaxInt<unsigned_int> local_78;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  switch(*in_RSI) {
  case 0:
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8,0);
    miniscript::internal::Ops::Ops
              (in_stack_fffffffffffffbd8,0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    break;
  case 1:
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8,0);
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
    miniscript::internal::Ops::Ops
              (in_stack_fffffffffffffbd8,0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    break;
  case 2:
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8,0);
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8,0);
    miniscript::internal::Ops::Ops
              (in_stack_fffffffffffffbd8,0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    break;
  case 3:
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8,0);
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8,0);
    miniscript::internal::Ops::Ops
              (in_stack_fffffffffffffbd8,0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    break;
  case 4:
  case 5:
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8,0);
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
    miniscript::internal::Ops::Ops
              (in_stack_fffffffffffffbd8,0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    break;
  case 6:
  case 7:
  case 8:
  case 9:
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8,0);
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
    miniscript::internal::Ops::Ops
              (in_stack_fffffffffffffbd8,0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    break;
  case 10:
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    peVar3 = std::
             __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)in_stack_fffffffffffffbd8);
    local_190 = (peVar3->ops).sat;
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    peVar3 = std::
             __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)in_stack_fffffffffffffbd8);
    local_198 = (peVar3->ops).dsat;
    miniscript::internal::Ops::Ops
              (in_stack_fffffffffffffbd8,0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    break;
  case 0xb:
  case 0xc:
  case 0x10:
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    peVar3 = std::
             __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)in_stack_fffffffffffffbd8);
    local_180 = (peVar3->ops).sat;
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    peVar3 = std::
             __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)in_stack_fffffffffffffbd8);
    local_188 = (peVar3->ops).dsat;
    miniscript::internal::Ops::Ops
              (in_stack_fffffffffffffbd8,0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    break;
  case 0xd:
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    peVar3 = std::
             __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)in_stack_fffffffffffffbd8);
    local_1a0 = (peVar3->ops).sat;
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8,0);
    miniscript::internal::Ops::Ops
              (in_stack_fffffffffffffbd8,0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    break;
  case 0xe:
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    local_1bc = (uint32_t)GetType((Node<XOnlyPubKey> *)in_stack_fffffffffffffbe0);
    Type::operator<<((Type *)in_stack_fffffffffffffbe0,(Type)in_stack_fffffffffffffbe8.value);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    peVar3 = std::
             __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)in_stack_fffffffffffffbd8);
    local_1c4 = (peVar3->ops).sat;
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
    miniscript::internal::Ops::Ops
              (in_stack_fffffffffffffbd8,0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    break;
  case 0xf:
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    peVar3 = std::
             __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)in_stack_fffffffffffffbd8);
    local_1b0 = (peVar3->ops).sat;
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8,0);
    miniscript::internal::Ops::Ops
              (in_stack_fffffffffffffbd8,0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    break;
  case 0x11:
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    miniscript::internal::operator+
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbe0,
               (MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
    miniscript::internal::Ops::Ops
              (in_stack_fffffffffffffbd8,0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    break;
  case 0x12:
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    local_78 = miniscript::internal::operator+
                         ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbe0,
                          (MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    local_90 = miniscript::internal::operator+
                         ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbe0,
                          (MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
    local_88 = local_78;
    local_80 = local_90;
    miniscript::internal::Ops::Ops
              (in_stack_fffffffffffffbd8,0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    break;
  case 0x13:
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    local_a0 = miniscript::internal::operator+
                         ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbe0,
                          (MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    local_a8 = miniscript::internal::operator+
                         ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbe0,
                          (MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
    local_98 = miniscript::internal::operator|
                         ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbe0,
                          (MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    local_c0 = miniscript::internal::operator+
                         ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbe0,
                          (MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
    local_b8 = local_98;
    local_b0 = local_c0;
    miniscript::internal::Ops::Ops
              (in_stack_fffffffffffffbd8,0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    break;
  case 0x14:
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    local_f8 = miniscript::internal::operator+
                         ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbe0,
                          (MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
    local_100 = miniscript::internal::operator|
                          ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbe0,
                           (MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
    local_f0 = local_100;
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
    miniscript::internal::Ops::Ops
              (in_stack_fffffffffffffbd8,0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    break;
  case 0x15:
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    local_d0 = miniscript::internal::operator+
                         ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbe0,
                          (MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
    local_c8 = miniscript::internal::operator|
                         ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbe0,
                          (MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    local_e8 = miniscript::internal::operator+
                         ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbe0,
                          (MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
    local_e0 = local_c8;
    local_d8 = local_e8;
    miniscript::internal::Ops::Ops
              (in_stack_fffffffffffffbd8,0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    break;
  case 0x16:
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    local_110 = miniscript::internal::operator|
                          ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbe0,
                           (MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    local_128 = miniscript::internal::operator|
                          ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbe0,
                           (MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
    local_120 = local_110;
    local_118 = local_128;
    miniscript::internal::Ops::Ops
              (in_stack_fffffffffffffbd8,0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    break;
  case 0x17:
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    local_138 = miniscript::internal::operator+
                          ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbe0,
                           (MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    local_140 = miniscript::internal::operator+
                          ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbe0,
                           (MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
    local_130 = miniscript::internal::operator|
                          ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbe0,
                           (MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffffbd8);
    local_158 = miniscript::internal::operator+
                          ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbe0,
                           (MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
    local_150 = local_130;
    local_148 = local_158;
    miniscript::internal::Ops::Ops
              (in_stack_fffffffffffffbd8,0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    break;
  case 0x18:
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8,0);
    Vector<miniscript::internal::MaxInt<unsigned_int>>
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc18);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::begin((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
             *)in_stack_fffffffffffffbe0);
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::end((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
           *)in_stack_fffffffffffffbe0);
    while (bVar2 = __gnu_cxx::
                   operator==<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>_>
                             ((__normal_iterator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>_>
                               *)in_stack_fffffffffffffbe8,
                              (__normal_iterator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>_>
                               *)in_stack_fffffffffffffbe0), ((bVar2 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>_>
      ::operator*((__normal_iterator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>_>
                   *)in_stack_fffffffffffffbd8);
      std::
      __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)in_stack_fffffffffffffbd8);
      std::
      vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
      ::operator[]((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                    *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
      std::
      __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)in_stack_fffffffffffffbd8);
      miniscript::internal::operator+
                ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbe0,
                 (MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
      Vector<miniscript::internal::MaxInt<unsigned_int>>
                ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc18);
      for (local_2a8 = 1;
          sVar4 = std::
                  vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                  ::size((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                          *)in_stack_fffffffffffffbd8), local_2a8 < sVar4; local_2a8 = local_2a8 + 1
          ) {
        std::
        vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
        ::operator[]((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                      *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
        std::
        __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_stack_fffffffffffffbd8);
        miniscript::internal::operator+
                  ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbe0,
                   (MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
        std::
        vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
        ::operator[]((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                      *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
        std::
        __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_stack_fffffffffffffbd8);
        miniscript::internal::operator+
                  ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbe0,
                   (MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
        in_stack_fffffffffffffc18 =
             miniscript::internal::operator|
                       ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbe0,
                        (MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
        std::
        vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
        ::push_back((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                     *)in_stack_fffffffffffffbd8,(value_type *)0x79d0e9);
      }
      std::
      vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
      ::size((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
              *)in_stack_fffffffffffffbd8);
      std::
      vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
      ::operator[]((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                    *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
      std::
      __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)in_stack_fffffffffffffbd8);
      miniscript::internal::operator+
                ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbe0,
                 (MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8);
      std::
      vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
      ::push_back((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                   *)in_stack_fffffffffffffbd8,(value_type *)0x79d1bb);
      std::
      vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
      ::operator=((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                   *)in_stack_fffffffffffffbe8,
                  (vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                   *)in_stack_fffffffffffffbe0);
      std::
      vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
      ::~vector((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                 *)in_stack_fffffffffffffbe8);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>_>
      ::operator++((__normal_iterator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>_>
                    *)in_stack_fffffffffffffbd8);
    }
    uVar1 = in_RSI[1];
    sVar4 = std::
            vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
            ::size((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                    *)in_stack_fffffffffffffbd8);
    if (sVar4 < uVar1) {
      __assert_fail("k <= sats.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                    ,0x3db,
                    "internal::Ops miniscript::Node<XOnlyPubKey>::CalcOps() const [Key = XOnlyPubKey]"
                   );
    }
    in_sat = (MaxInt<unsigned_int>)local_1e8;
    std::
    vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ::operator[]((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                  *)in_sat,(size_type)in_stack_fffffffffffffbe0);
    std::
    vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ::operator[]((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                  *)in_sat,(size_type)in_stack_fffffffffffffbe0);
    miniscript::internal::Ops::Ops(in_stack_fffffffffffffbd8,0,in_sat,in_stack_fffffffffffffbe0);
    std::
    vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ::~vector((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
               *)in_sat);
    break;
  case 0x19:
    std::vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>::size
              ((vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_> *)in_stack_fffffffffffffbd8);
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8,0);
    std::vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>::size
              ((vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_> *)in_stack_fffffffffffffbd8);
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8,0);
    miniscript::internal::Ops::Ops
              (in_stack_fffffffffffffbd8,0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    break;
  case 0x1a:
    std::vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>::size
              ((vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_> *)in_stack_fffffffffffffbd8);
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8,0);
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffbd8,0);
    miniscript::internal::Ops::Ops
              (in_stack_fffffffffffffbd8,0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                  ,0x3df,
                  "internal::Ops miniscript::Node<XOnlyPubKey>::CalcOps() const [Key = XOnlyPubKey]"
                 );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

internal::Ops CalcOps() const {
        switch (fragment) {
            case Fragment::JUST_1: return {0, 0, {}};
            case Fragment::JUST_0: return {0, {}, 0};
            case Fragment::PK_K: return {0, 0, 0};
            case Fragment::PK_H: return {3, 0, 0};
            case Fragment::OLDER:
            case Fragment::AFTER: return {1, 0, {}};
            case Fragment::SHA256:
            case Fragment::RIPEMD160:
            case Fragment::HASH256:
            case Fragment::HASH160: return {4, 0, {}};
            case Fragment::AND_V: return {subs[0]->ops.count + subs[1]->ops.count, subs[0]->ops.sat + subs[1]->ops.sat, {}};
            case Fragment::AND_B: {
                const auto count{1 + subs[0]->ops.count + subs[1]->ops.count};
                const auto sat{subs[0]->ops.sat + subs[1]->ops.sat};
                const auto dsat{subs[0]->ops.dsat + subs[1]->ops.dsat};
                return {count, sat, dsat};
            }
            case Fragment::OR_B: {
                const auto count{1 + subs[0]->ops.count + subs[1]->ops.count};
                const auto sat{(subs[0]->ops.sat + subs[1]->ops.dsat) | (subs[1]->ops.sat + subs[0]->ops.dsat)};
                const auto dsat{subs[0]->ops.dsat + subs[1]->ops.dsat};
                return {count, sat, dsat};
            }
            case Fragment::OR_D: {
                const auto count{3 + subs[0]->ops.count + subs[1]->ops.count};
                const auto sat{subs[0]->ops.sat | (subs[1]->ops.sat + subs[0]->ops.dsat)};
                const auto dsat{subs[0]->ops.dsat + subs[1]->ops.dsat};
                return {count, sat, dsat};
            }
            case Fragment::OR_C: {
                const auto count{2 + subs[0]->ops.count + subs[1]->ops.count};
                const auto sat{subs[0]->ops.sat | (subs[1]->ops.sat + subs[0]->ops.dsat)};
                return {count, sat, {}};
            }
            case Fragment::OR_I: {
                const auto count{3 + subs[0]->ops.count + subs[1]->ops.count};
                const auto sat{subs[0]->ops.sat | subs[1]->ops.sat};
                const auto dsat{subs[0]->ops.dsat | subs[1]->ops.dsat};
                return {count, sat, dsat};
            }
            case Fragment::ANDOR: {
                const auto count{3 + subs[0]->ops.count + subs[1]->ops.count + subs[2]->ops.count};
                const auto sat{(subs[1]->ops.sat + subs[0]->ops.sat) | (subs[0]->ops.dsat + subs[2]->ops.sat)};
                const auto dsat{subs[0]->ops.dsat + subs[2]->ops.dsat};
                return {count, sat, dsat};
            }
            case Fragment::MULTI: return {1, (uint32_t)keys.size(), (uint32_t)keys.size()};
            case Fragment::MULTI_A: return {(uint32_t)keys.size() + 1, 0, 0};
            case Fragment::WRAP_S:
            case Fragment::WRAP_C:
            case Fragment::WRAP_N: return {1 + subs[0]->ops.count, subs[0]->ops.sat, subs[0]->ops.dsat};
            case Fragment::WRAP_A: return {2 + subs[0]->ops.count, subs[0]->ops.sat, subs[0]->ops.dsat};
            case Fragment::WRAP_D: return {3 + subs[0]->ops.count, subs[0]->ops.sat, 0};
            case Fragment::WRAP_J: return {4 + subs[0]->ops.count, subs[0]->ops.sat, 0};
            case Fragment::WRAP_V: return {subs[0]->ops.count + (subs[0]->GetType() << "x"_mst), subs[0]->ops.sat, {}};
            case Fragment::THRESH: {
                uint32_t count = 0;
                auto sats = Vector(internal::MaxInt<uint32_t>(0));
                for (const auto& sub : subs) {
                    count += sub->ops.count + 1;
                    auto next_sats = Vector(sats[0] + sub->ops.dsat);
                    for (size_t j = 1; j < sats.size(); ++j) next_sats.push_back((sats[j] + sub->ops.dsat) | (sats[j - 1] + sub->ops.sat));
                    next_sats.push_back(sats[sats.size() - 1] + sub->ops.sat);
                    sats = std::move(next_sats);
                }
                assert(k <= sats.size());
                return {count, sats[k], sats[0]};
            }
        }
        assert(false);
    }